

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library_open.c
# Opt level: O0

mpt_libhandle * mpt_library_open(char *lib,char *lpath)

{
  int *piVar1;
  size_t sVar2;
  ulong local_448;
  size_t len;
  size_t left;
  char buf [1024];
  char *sep;
  void *newlib;
  mpt_libhandle *lh;
  char *lpath_local;
  char *lib_local;
  
  if (lib == (char *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    lib_local = (char *)0x0;
  }
  else if ((lpath == (char *)0x0) || (lh = (mpt_libhandle *)lpath, *lib == '/')) {
    sep = (char *)dlopen(lib,2);
    if (sep == (char *)0x0) {
      piVar1 = __errno_location();
      *piVar1 = 2;
      lib_local = (char *)0x0;
    }
    else {
LAB_00101f4d:
      lib_local = (char *)malloc(0x10);
      if (lib_local == (char *)0x0) {
        dlclose(sep);
        dlerror();
        piVar1 = __errno_location();
        *piVar1 = 0xc;
        lib_local = (char *)0x0;
      }
      else {
        lib_local[0] = '\x01';
        lib_local[1] = '\0';
        lib_local[2] = '\0';
        lib_local[3] = '\0';
        lib_local[4] = '\0';
        lib_local[5] = '\0';
        lib_local[6] = '\0';
        lib_local[7] = '\0';
        *(char **)(lib_local + 8) = sep;
      }
    }
  }
  else {
    while ((lh != (mpt_libhandle *)0x0 && ((char)(lh->_ref)._val != '\0'))) {
      buf._1016_8_ = strchr((char *)lh,0x3a);
      if ((char *)buf._1016_8_ == (char *)0x0) {
        local_448 = strlen((char *)lh);
      }
      else {
        local_448 = buf._1016_8_ - (long)lh;
        buf._1016_8_ = (char *)(buf._1016_8_ + 1);
      }
      if (0x3ff < local_448) {
        piVar1 = __errno_location();
        *piVar1 = 0x69;
        return (mpt_libhandle *)0x0;
      }
      memcpy(&left,lh,local_448);
      buf[local_448 - 8] = '/';
      sVar2 = strlen(lib);
      if (0x3ff - local_448 <= sVar2) {
        piVar1 = __errno_location();
        *piVar1 = 0x69;
        return (mpt_libhandle *)0x0;
      }
      memcpy(buf + (local_448 - 7),lib,sVar2 + 1);
      sep = (char *)dlopen(&left,2);
      if (sep != (char *)0x0) goto LAB_00101f4d;
      lh = (mpt_libhandle *)buf._1016_8_;
    }
    piVar1 = __errno_location();
    *piVar1 = 2;
    lib_local = (char *)0x0;
  }
  return (mpt_libhandle *)lib_local;
}

Assistant:

extern MPT_STRUCT(libhandle) *mpt_library_open(const char *lib, const char *lpath)
{
	MPT_STRUCT(libhandle) *lh;
	void *newlib;
	
	if (!lib) {
		errno = EINVAL;
		return 0;
	}
	/* no resolution if path absolute */
	if (!lpath || *lib == '/') {
		if (!(newlib = dlopen(lib, RTLD_NOW))) {
			errno = ENOENT;
			return 0;
		}
	}
	else while (1) {
		const char *sep;
		char buf[1024];
		size_t left, len;
		
		if (!lpath || !*lpath) {
			errno = ENOENT;
			return 0;
		}
		if ((sep = strchr(lpath, ':'))) {
			len = sep++ - lpath;
		} else {
			len = strlen(lpath);
		}
		/* set library path */
		if (len >= sizeof(buf)) {
			errno = ENOBUFS;
			return 0;
		}
		left = sizeof(buf) - len;
		memcpy(buf, lpath, len);
		buf[len++] = '/';
		newlib = buf + len;
		
		/* buffer too small */
		if (--left <= (len = strlen(lib))) {
			errno = ENOBUFS;
			return 0;
		}
		memcpy(newlib, lib, len + 1);
		
		if ((newlib = dlopen(buf, RTLD_NOW))) {
			break;
		}
		lpath = sep;
	}
	if (!(lh = malloc(sizeof(*lh)))) {
		dlclose(newlib);
		dlerror();
		errno = ENOMEM;
		return 0;
	}
	lh->_ref._val = 1;
	lh->addr = newlib;
	
	return lh;
}